

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O2

void decode_string(uint8_t *dst,uint8_t *src)

{
  int i;
  long lVar1;
  long lVar2;
  uint8_t (*pauVar3) [3];
  byte bVar4;
  
  lVar1 = 0;
  lVar2 = 0;
  while( true ) {
    bVar4 = src[lVar1];
    lVar2 = (long)(int)lVar2;
    if (bVar4 == 0) break;
    for (pauVar3 = bca; *(uint8_t *)((long)pauVar3 + (ulong)bVar4 * 3) != '\0';
        pauVar3 = (uint8_t (*) [3])((long)pauVar3 + 1)) {
      dst[lVar2] = *(uint8_t *)((long)pauVar3 + (ulong)bVar4 * 3);
      lVar2 = lVar2 + 1;
      bVar4 = src[lVar1];
    }
    lVar1 = lVar1 + 1;
  }
  dst[lVar2] = '\0';
  return;
}

Assistant:

void decode_string(uint8_t dst[], uint8_t src[]) {
    int j = 0;
    for (int i = 0; src[i]; i++) {
        for (int k = 0; bca[src[i]][k]; ++k) {
            dst[j++] = bca[src[i]][k];
        }
    }
    dst[j] = '\0'; //terminator
}